

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

PointAttribute * __thiscall
draco::PointCloud::GetNamedAttributeByUniqueId(PointCloud *this,Type type,uint32_t unique_id)

{
  pointer piVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  size_t att_id;
  long lVar3;
  
  piVar1 = this->named_attribute_index_[type].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    if ((long)this->named_attribute_index_[type].super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2 == lVar3) {
      return (PointAttribute *)0x0;
    }
    _Var2._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (this->attributes_).
         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[piVar1[lVar3]]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t;
    lVar3 = lVar3 + 1;
  } while (*(uint32_t *)
            ((long)_Var2._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x3c) !=
           unique_id);
  return (PointAttribute *)
         (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
}

Assistant:

const PointAttribute *PointCloud::GetNamedAttributeByUniqueId(
    GeometryAttribute::Type type, uint32_t unique_id) const {
  for (size_t att_id = 0; att_id < named_attribute_index_[type].size();
       ++att_id) {
    if (attributes_[named_attribute_index_[type][att_id]]->unique_id() ==
        unique_id) {
      return attributes_[named_attribute_index_[type][att_id]].get();
    }
  }
  return nullptr;
}